

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O1

void __thiscall
HighsSimplexAnalysis::dualSteepestEdgeWeightError
          (HighsSimplexAnalysis *this,double computed_edge_weight,double updated_edge_weight)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  string error_type;
  double local_48;
  double dStack_40;
  undefined1 *local_38;
  char *local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"  OK","");
  this->num_dual_steepest_edge_weight_check = this->num_dual_steepest_edge_weight_check + 1;
  if (updated_edge_weight < computed_edge_weight * 0.25) {
    this->num_dual_steepest_edge_weight_reject = this->num_dual_steepest_edge_weight_reject + 1;
  }
  if (computed_edge_weight <= updated_edge_weight) {
    dVar5 = updated_edge_weight / computed_edge_weight;
    lVar4 = 0x970;
    if (4.0 < dVar5) {
      std::__cxx11::string::_M_replace((ulong)&local_38,0,local_30,0x3ddd43);
      local_48 = 0.0;
      dStack_40 = 0.01;
      goto LAB_00365d0a;
    }
  }
  else {
    dVar5 = computed_edge_weight / updated_edge_weight;
    lVar4 = 0x968;
    if (4.0 < dVar5) {
      std::__cxx11::string::_M_replace((ulong)&local_38,0,local_30,0x3ddd3e);
      local_48 = 0.01;
      dStack_40 = 0.0;
      goto LAB_00365d0a;
    }
  }
  local_48 = 0.0;
  dStack_40 = 0.0;
LAB_00365d0a:
  dVar1 = *(double *)((long)&this->timer_ + lVar4);
  dVar5 = log(dVar5);
  *(double *)((long)&this->timer_ + lVar4) = dVar1 * 0.99 + dVar5 * 0.01;
  auVar6._0_8_ = this->average_frequency_low_dual_steepest_edge_weight * 0.99 + local_48;
  auVar6._8_8_ = this->average_frequency_high_dual_steepest_edge_weight * 0.99 + dStack_40;
  this->average_frequency_low_dual_steepest_edge_weight = auVar6._0_8_;
  this->average_frequency_high_dual_steepest_edge_weight = auVar6._8_8_;
  auVar7._0_8_ = this->max_average_frequency_low_dual_steepest_edge_weight;
  auVar7._8_8_ = this->max_average_frequency_high_dual_steepest_edge_weight;
  auVar9._0_8_ = auVar6._8_8_ + auVar6._0_8_;
  auVar7 = maxpd(auVar6,auVar7);
  this->max_average_frequency_low_dual_steepest_edge_weight = (double)auVar7._0_8_;
  this->max_average_frequency_high_dual_steepest_edge_weight = (double)auVar7._8_8_;
  auVar2._0_8_ = this->max_sum_average_frequency_extreme_dual_steepest_edge_weight;
  auVar2._8_8_ = this->max_average_log_low_dual_steepest_edge_weight_error;
  auVar9._8_8_ = this->average_log_low_dual_steepest_edge_weight_error;
  auVar7 = maxpd(auVar9,auVar2);
  this->max_sum_average_frequency_extreme_dual_steepest_edge_weight = (double)auVar7._0_8_;
  this->max_average_log_low_dual_steepest_edge_weight_error = (double)auVar7._8_8_;
  auVar3._0_8_ = this->max_average_log_high_dual_steepest_edge_weight_error;
  auVar3._8_8_ = this->max_sum_average_log_extreme_dual_steepest_edge_weight_error;
  auVar8._8_8_ = this->average_log_low_dual_steepest_edge_weight_error +
                 this->average_log_high_dual_steepest_edge_weight_error;
  auVar8._0_8_ = this->average_log_high_dual_steepest_edge_weight_error;
  auVar7 = maxpd(auVar8,auVar3);
  this->max_average_log_high_dual_steepest_edge_weight_error = (double)auVar7._0_8_;
  this->max_sum_average_log_extreme_dual_steepest_edge_weight_error = (double)auVar7._8_8_;
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::dualSteepestEdgeWeightError(
    const double computed_edge_weight, const double updated_edge_weight) {
  const double kWeightErrorThreshold = 4.0;
  const bool accept_weight =
      updated_edge_weight >= kAcceptDseWeightThreshold * computed_edge_weight;
  HighsInt low_weight_error = 0;
  HighsInt high_weight_error = 0;
  double weight_error;
  string error_type = "  OK";
  num_dual_steepest_edge_weight_check++;
  if (!accept_weight) num_dual_steepest_edge_weight_reject++;
  if (updated_edge_weight < computed_edge_weight) {
    // Updated weight is low
    weight_error = computed_edge_weight / updated_edge_weight;
    if (weight_error > kWeightErrorThreshold) {
      low_weight_error = 1;
      error_type = " Low";
    }
    average_log_low_dual_steepest_edge_weight_error =
        0.99 * average_log_low_dual_steepest_edge_weight_error +
        0.01 * log(weight_error);
  } else {
    // Updated weight is correct or high
    weight_error = updated_edge_weight / computed_edge_weight;
    if (weight_error > kWeightErrorThreshold) {
      high_weight_error = 1;
      error_type = "High";
    }
    average_log_high_dual_steepest_edge_weight_error =
        0.99 * average_log_high_dual_steepest_edge_weight_error +
        0.01 * log(weight_error);
  }
  average_frequency_low_dual_steepest_edge_weight =
      0.99 * average_frequency_low_dual_steepest_edge_weight +
      0.01 * low_weight_error;
  average_frequency_high_dual_steepest_edge_weight =
      0.99 * average_frequency_high_dual_steepest_edge_weight +
      0.01 * high_weight_error;
  max_average_frequency_low_dual_steepest_edge_weight =
      max(max_average_frequency_low_dual_steepest_edge_weight,
          average_frequency_low_dual_steepest_edge_weight);
  max_average_frequency_high_dual_steepest_edge_weight =
      max(max_average_frequency_high_dual_steepest_edge_weight,
          average_frequency_high_dual_steepest_edge_weight);
  max_sum_average_frequency_extreme_dual_steepest_edge_weight =
      max(max_sum_average_frequency_extreme_dual_steepest_edge_weight,
          average_frequency_low_dual_steepest_edge_weight +
              average_frequency_high_dual_steepest_edge_weight);
  max_average_log_low_dual_steepest_edge_weight_error =
      max(max_average_log_low_dual_steepest_edge_weight_error,
          average_log_low_dual_steepest_edge_weight_error);
  max_average_log_high_dual_steepest_edge_weight_error =
      max(max_average_log_high_dual_steepest_edge_weight_error,
          average_log_high_dual_steepest_edge_weight_error);
  max_sum_average_log_extreme_dual_steepest_edge_weight_error =
      max(max_sum_average_log_extreme_dual_steepest_edge_weight_error,
          average_log_low_dual_steepest_edge_weight_error +
              average_log_high_dual_steepest_edge_weight_error);
  if (analyse_simplex_runtime_data) {
    const bool report_weight_error = false;
    if (report_weight_error && weight_error > 0.5 * kWeightErrorThreshold) {
      printf(
          "DSE Wt Ck |%8" HIGHSINT_FORMAT "| OK = %1d (%4" HIGHSINT_FORMAT
          " / %6" HIGHSINT_FORMAT
          ") (c %10.4g, u %10.4g, er %10.4g "
          "- "
          "%s): Low (Fq %10.4g, Er %10.4g); High (Fq%10.4g, Er%10.4g) | %10.4g "
          "%10.4g %10.4g %10.4g %10.4g %10.4g\n",
          simplex_iteration_count, accept_weight,
          num_dual_steepest_edge_weight_check,
          num_dual_steepest_edge_weight_reject, computed_edge_weight,
          updated_edge_weight, weight_error, error_type.c_str(),
          average_frequency_low_dual_steepest_edge_weight,
          average_log_low_dual_steepest_edge_weight_error,
          average_frequency_high_dual_steepest_edge_weight,
          average_log_high_dual_steepest_edge_weight_error,
          max_average_frequency_low_dual_steepest_edge_weight,
          max_average_frequency_high_dual_steepest_edge_weight,
          max_sum_average_frequency_extreme_dual_steepest_edge_weight,
          max_average_log_low_dual_steepest_edge_weight_error,
          max_average_log_high_dual_steepest_edge_weight_error,
          max_sum_average_log_extreme_dual_steepest_edge_weight_error);
    }
  }
}